

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O2

VirtualIterator<unsigned_int> __thiscall Kernel::Clause::getVariableIterator(Clause *this)

{
  MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_Kernel::Literal_*const_&>_>,_Kernel::VariableIteratorFn,_Lib::VirtualIterator<Kernel::TermList>_>
  master;
  long in_RSI;
  VirtualIterator<unsigned_int> local_a0;
  undefined8 local_98;
  undefined8 local_88;
  uint uStack_80;
  undefined4 uStack_7c;
  MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_Kernel::Literal_*const_&>_>,_Kernel::VariableIteratorFn,_Lib::VirtualIterator<Kernel::TermList>_>_>,_Kernel::OrdVarNumberExtractorFn,_unsigned_int>
  local_78;
  FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_Kernel::Literal_*const_&>_>,_Kernel::VariableIteratorFn,_Lib::VirtualIterator<Kernel::TermList>_>_>
  local_40;
  
  uStack_80 = *(uint *)(in_RSI + 0x38) & 0xfffff;
  local_88 = 0;
  master._inner._iter._func.a = (Literal *(*) [1])in_RSI;
  master._0_8_ = local_98;
  master._inner._iter._inner._next = 0;
  master._inner._iter._inner._from = 0;
  master._inner._iter._16_8_ = CONCAT44(uStack_7c,*(uint *)(in_RSI + 0x38)) & 0xffffffff000fffff;
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_Kernel::Literal_*const_&>_>,_Kernel::VariableIteratorFn,_Lib::VirtualIterator<Kernel::TermList>_>_>
  ::FlatteningIterator(&local_40,master);
  Lib::
  getMappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause_const&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*const&>>,Kernel::VariableIteratorFn,Lib::VirtualIterator<Kernel::TermList>>>,Kernel::OrdVarNumberExtractorFn>
            (&local_78,(Lib *)&local_40);
  Lib::
  getUniquePersistentIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause_const&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*const&>>,Kernel::VariableIteratorFn,Lib::VirtualIterator<Kernel::TermList>>>,Kernel::OrdVarNumberExtractorFn,unsigned_int>>
            ((Lib *)&local_a0,&local_78);
  Lib::pvi<Lib::VirtualIterator<unsigned_int>>((Lib *)this,&local_a0);
  Lib::VirtualIterator<unsigned_int>::~VirtualIterator(&local_a0);
  Lib::OptionBase<Lib::VirtualIterator<Kernel::TermList>_>::~OptionBase
            (&local_78._inner._current.super_OptionBase<Lib::VirtualIterator<Kernel::TermList>_>);
  Lib::OptionBase<Lib::VirtualIterator<Kernel::TermList>_>::~OptionBase
            (&local_40._current.super_OptionBase<Lib::VirtualIterator<Kernel::TermList>_>);
  return (VirtualIterator<unsigned_int>)(IteratorCore<unsigned_int> *)this;
}

Assistant:

VirtualIterator<unsigned> Clause::getVariableIterator() const
{
  return pvi( getUniquePersistentIterator(
      getMappingIterator(
	  getMapAndFlattenIterator(
	      iterLits(),
	      VariableIteratorFn()),
	  OrdVarNumberExtractorFn())));
}